

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base64.cpp
# Opt level: O1

bool __thiscall
ON_Base64EncodeStream::In(ON_Base64EncodeStream *this,ON__UINT64 in_buffer_size,void *in_buffer)

{
  uint *puVar1;
  uint *puVar2;
  char cVar3;
  ON__UINT32 OVar4;
  ON__UINT32 OVar5;
  int iVar6;
  ulong uVar7;
  ulong __n;
  
  if (in_buffer_size == 0) {
    return true;
  }
  puVar2 = (uint *)this->m_implementation;
  if ((puVar2 == (uint *)0x0) || (in_buffer == (void *)0x0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_base64.cpp"
               ,0x2d5,"","ON_UncompressStream error");
    return false;
  }
  uVar7 = (ulong)*puVar2;
  if (uVar7 != 0) {
    __n = (ulong)(0x39 - *puVar2);
    if (in_buffer_size < __n) {
      memcpy((void *)((long)puVar2 + uVar7 + 4),in_buffer,in_buffer_size & 0xffffffff);
      *puVar2 = *puVar2 + (int)in_buffer_size;
      return true;
    }
    memcpy((void *)((long)puVar2 + uVar7 + 4),in_buffer,__n);
    puVar1 = puVar2 + 0x11;
    EncodeBase64Helper57((uchar *)(puVar2 + 1),(char *)puVar1);
    *puVar2 = 0;
    OVar4 = ON_CRC32(this->m_out_crc,0x4c,puVar1);
    if (this->m_out_callback_function == (ON_StreamCallbackFunction)0x0) {
      iVar6 = (*this->_vptr_ON_Base64EncodeStream[2])(this,this->m_out_callback_context,0x4c,puVar1)
      ;
      cVar3 = (char)iVar6;
    }
    else {
      cVar3 = (*this->m_out_callback_function)(this->m_out_callback_context,0x4c,puVar1);
    }
    if (cVar3 == '\0') {
LAB_003c4375:
      onfree(this->m_implementation);
      this->m_implementation = (void *)0x0;
      return false;
    }
    in_buffer = (void *)((long)in_buffer + __n);
    OVar5 = ON_CRC32(this->m_in_crc,0x39,puVar2 + 1);
    this->m_in_crc = OVar5;
    this->m_in_size = this->m_in_size + 0x39;
    this->m_out_crc = OVar4;
    this->m_out_size = this->m_out_size + 0x4c;
    in_buffer_size = in_buffer_size - __n;
  }
  if (0x38 < in_buffer_size) {
    puVar1 = puVar2 + 0x11;
    do {
      EncodeBase64Helper57((uchar *)in_buffer,(char *)puVar1);
      OVar4 = ON_CRC32(this->m_out_crc,0x4c,puVar1);
      if (this->m_out_callback_function == (ON_StreamCallbackFunction)0x0) {
        iVar6 = (*this->_vptr_ON_Base64EncodeStream[2])
                          (this,this->m_out_callback_context,0x4c,puVar1);
        cVar3 = (char)iVar6;
      }
      else {
        cVar3 = (*this->m_out_callback_function)(this->m_out_callback_context,0x4c,puVar1);
      }
      if (cVar3 == '\0') goto LAB_003c4375;
      OVar5 = ON_CRC32(this->m_in_crc,0x39,in_buffer);
      this->m_in_crc = OVar5;
      this->m_in_size = this->m_in_size + 0x39;
      this->m_out_crc = OVar4;
      this->m_out_size = this->m_out_size + 0x4c;
      in_buffer = (void *)((long)in_buffer + 0x39);
      in_buffer_size = in_buffer_size - 0x39;
    } while (0x38 < in_buffer_size);
  }
  if (in_buffer_size != 0) {
    memcpy(puVar2 + 1,in_buffer,in_buffer_size);
  }
  *puVar2 = (uint)in_buffer_size;
  return true;
}

Assistant:

bool ON_Base64EncodeStream::In(
    ON__UINT64 in_buffer_size,
    const void* in_buffer
    )
{
  if ( in_buffer_size <= 0 )
    return true;

  if ( 0 == m_implementation )
  {
    ErrorHandler();
    return false;
  }

  if ( 0 == in_buffer )
  {
    ErrorHandler();
    return false;
  }
  
  bool rc = false;
  ON__UINT32 crc1;
  ON__UINT32 sz;

  ON_Base64EncodeImplementation* imp = (ON_Base64EncodeImplementation*)m_implementation;
  if ( imp->m_in_buffer_size > 0 )
  {
    // residual input left from the previous call to In()
    sz = 57 - imp->m_in_buffer_size;
    if ( in_buffer_size < sz )
    {
      // still don't have sizeof(imp->m_in_buffer_size) bytes of input
      sz = (ON__UINT32)in_buffer_size; // cast is safe because in_buffer_size < sizeof(imp->m_in_buffer_size) <= 8192
      memcpy( imp->m_in_buffer + imp->m_in_buffer_size, in_buffer, sz );
      imp->m_in_buffer_size += sz;
      return true;
    }

    memcpy( imp->m_in_buffer + imp->m_in_buffer_size, in_buffer, sz );
    in_buffer = ((const unsigned char*)in_buffer) + sz;
    in_buffer_size -= sz;

    EncodeBase64Helper57(imp->m_in_buffer,imp->m_out_buffer);
    imp->m_in_buffer_size = 0;

    crc1 = ON_CRC32(m_out_crc,76,imp->m_out_buffer);
    rc = ( 0 != m_out_callback_function )
        ? m_out_callback_function(m_out_callback_context,76,imp->m_out_buffer)
        : Out(m_out_callback_context,76,imp->m_out_buffer);
    if ( !rc )
    {
      onfree(m_implementation);
      m_implementation = 0;
      return false;
    }
    m_in_crc = ON_CRC32(m_in_crc,57,imp->m_in_buffer);
    m_in_size += 57;
    m_out_crc = crc1;
    m_out_size += 76;
  }

  while(in_buffer_size >= 57 )
  {
    // base 64 encode 57 input bytes to create 76 output bytes
    EncodeBase64Helper57((const unsigned char*)in_buffer,imp->m_out_buffer);
    crc1 = ON_CRC32(m_out_crc,76,imp->m_out_buffer);
    rc = ( 0 != m_out_callback_function )
        ? m_out_callback_function(m_out_callback_context,76,imp->m_out_buffer)
        : Out(m_out_callback_context,76,imp->m_out_buffer);
    if ( !rc )
    {
      onfree(m_implementation);
      m_implementation = 0;
      return false;
    }
    m_in_crc = ON_CRC32(m_in_crc,57,in_buffer);
    m_in_size += 57;
    m_out_crc = crc1;
    m_out_size += 76;
    in_buffer = ((const unsigned char*)in_buffer) + 57;
    in_buffer_size -= 57;
  }

  if ( in_buffer_size > 0 )
  {
    // store what's left of the input in imp->m_in_buffer[]
    memcpy(imp->m_in_buffer,in_buffer,(size_t)in_buffer_size);
  }
  imp->m_in_buffer_size = (ON__UINT32)in_buffer_size; // safe cast - sizeof_buffer < 57

  return true;
}